

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int RWops20to12_close(SDL12_RWops *rwops12)

{
  int local_14;
  int rc;
  SDL12_RWops *rwops12_local;
  
  local_14 = 0;
  if ((rwops12 != (SDL12_RWops *)0x0) &&
     (local_14 = (*rwops12->rwops20->close)(rwops12->rwops20), local_14 == 0)) {
    SDL_FreeRW(rwops12);
  }
  return local_14;
}

Assistant:

static int SDLCALL
RWops20to12_close(struct SDL12_RWops *rwops12)
{
    int rc = 0;
    if (rwops12) {
        rc = rwops12->rwops20->close(rwops12->rwops20);
        if (rc == 0) {
            SDL_FreeRW(rwops12);
        }
    }
    return rc;
}